

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool absl::debugging_internal::ParseSeqId(State *state)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  
  iVar3 = state->recursion_depth;
  iVar4 = state->steps;
  state->recursion_depth = iVar3 + 1;
  state->steps = iVar4 + 1;
  if (iVar4 < 0x20000 && iVar3 < 0x100) {
    iVar4 = (state->parse_state).mangled_idx;
    pcVar5 = state->mangled_begin + iVar4;
    cVar2 = state->mangled_begin[iVar4];
    pcVar6 = pcVar5;
    while ((cVar2 != '\0' && ((byte)(cVar2 - 0x30U) < 10 || (byte)(cVar2 + 0xbfU) < 0x1a))) {
      pcVar1 = pcVar6 + 1;
      pcVar6 = pcVar6 + 1;
      cVar2 = *pcVar1;
    }
    bVar7 = pcVar6 != pcVar5;
    if (bVar7) {
      (state->parse_state).mangled_idx = ((int)pcVar6 - (int)pcVar5) + iVar4;
      bVar7 = true;
    }
  }
  else {
    bVar7 = false;
  }
  state->recursion_depth = iVar3;
  return bVar7;
}

Assistant:

explicit ComplexityGuard(State *state) : state_(state) {
    ++state->recursion_depth;
    ++state->steps;
  }